

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.c
# Opt level: O2

void MOVEGEN_piece(int type,int position,bitboard_t own,bitboard_t opponent,bitboard_t *moves,
                  bitboard_t *captures)

{
  switch(type) {
  case 0:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gustafullberg[P]drosophila/src/engine/movegen.c"
                  ,0xa1,
                  "void MOVEGEN_piece(const int, const int, const bitboard_t, const bitboard_t, bitboard_t *, bitboard_t *)"
                 );
  case 1:
    *captures = bitboard_knight[position] & opponent;
    *moves = ~(own | opponent) & bitboard_knight[position];
    return;
  case 2:
    MOVEGEN_bishop(position,own,opponent,moves,captures);
    return;
  case 3:
    MOVEGEN_rook(position,own,opponent,moves,captures);
    return;
  case 4:
    MOVEGEN_queen(position,own,opponent,moves,captures);
    return;
  case 5:
    *moves = ~(own | opponent) & bitboard_king[position];
    *captures = opponent & bitboard_king[position];
  }
  return;
}

Assistant:

void MOVEGEN_piece(const int type, const int position, const bitboard_t own, const bitboard_t opponent, bitboard_t *moves, bitboard_t *captures)
{
    switch(type) {
    case PAWN:
        /* MOVEGEN_all_pawns should be used instead */
        assert(0);
        break;
    case KNIGHT:
        MOVEGEN_knight(position, own, opponent, moves, captures);
        break;
    case BISHOP:
        MOVEGEN_bishop(position, own, opponent, moves, captures);
        break;
    case ROOK:
        MOVEGEN_rook(position, own, opponent, moves, captures);
        break;
    case QUEEN:
        MOVEGEN_queen(position, own, opponent, moves, captures);
        break;
    case KING:
        MOVEGEN_king(position, own, opponent, moves, captures);
        break;
    default:
        break;
    }
}